

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# three_dim_model.cpp
# Opt level: O0

int __thiscall
MODEL3D::three_dim_model::generate_non_fill_layer
          (three_dim_model *this,int *layer_number,int *mask_type)

{
  JoinType *pJVar1;
  pointer *this_00;
  bool bVar2;
  mapped_type *this_01;
  iterator __x;
  pointer ppVar3;
  mapped_type *pmVar4;
  reference __x_00;
  size_type sVar5;
  iterator __first;
  iterator __last;
  double delta;
  double delta_00;
  allocator<char> local_439;
  value_type local_438;
  string local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  string local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  allocator<char> local_391;
  value_type local_390;
  bool local_369;
  undefined1 local_368 [7];
  bool has_holes;
  Paths secondary_paths;
  Paths primary_paths;
  ClipperOffset co;
  Paths solution_paths;
  Clipper my_mask;
  __normal_iterator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_*,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>_>
  local_e0;
  const_iterator local_d8;
  __normal_iterator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_*,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>_>
  local_d0;
  iterator pos_it;
  iterator pos_end;
  Paths positive;
  Path my_path;
  __normal_iterator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_*,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>_>
  local_88;
  iterator poly_it;
  key_type_conflict local_6c;
  __normal_iterator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_*,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>_>
  local_68;
  iterator poly_end;
  Paths positives;
  double foot_adjustment;
  double countour_width;
  __normal_iterator<GEO::point_*,_std::vector<GEO::point,_std::allocator<GEO::point>_>_> local_30;
  double local_28;
  double cont_wid;
  int *mask_type_local;
  int *layer_number_local;
  three_dim_model *this_local;
  
  cont_wid = (double)mask_type;
  mask_type_local = layer_number;
  layer_number_local = (int *)this;
  this_01 = std::
            map<int,_std::vector<GEO::point,_std::allocator<GEO::point>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<GEO::point,_std::allocator<GEO::point>_>_>_>_>
            ::operator[](&this->etch_contour_map,layer_number);
  __x = std::vector<GEO::point,_std::allocator<GEO::point>_>::end(this_01);
  local_30 = std::
             prev<__gnu_cxx::__normal_iterator<GEO::point*,std::vector<GEO::point,std::allocator<GEO::point>>>>
                       (__x._M_current,1);
  ppVar3 = __gnu_cxx::
           __normal_iterator<GEO::point_*,_std::vector<GEO::point,_std::allocator<GEO::point>_>_>::
           operator->(&local_30);
  local_28 = ppVar3->x;
  delta = round(local_28 * 1.4);
  delta_00 = round(delta / -10.0);
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::vector((vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
            *)&poly_end);
  local_6c = *mask_type_local;
  pmVar4 = std::
           map<unsigned_int,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>_>_>_>
           ::operator[](&this->clipper_polygons_map,&local_6c);
  local_68._M_current =
       (vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
       std::
       vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
       ::end(pmVar4);
  my_path.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = *mask_type_local;
  pmVar4 = std::
           map<unsigned_int,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>_>_>_>
           ::operator[](&this->clipper_polygons_map,
                        (key_type_conflict *)
                        ((long)&my_path.
                                super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  local_88._M_current =
       (vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
       std::
       vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
       ::begin(pmVar4);
  while (bVar2 = __gnu_cxx::operator!=(&local_88,&local_68), bVar2) {
    __x_00 = __gnu_cxx::
             __normal_iterator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_*,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>_>
             ::operator*(&local_88);
    std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::vector
              ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
               &positive.
                super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,__x_00);
    std::
    vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ::vector((vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
              *)&pos_end);
    ClipperLib::SimplifyPolygon
              ((Path *)&positive.
                        super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                *)&pos_end,pftNonZero);
    sVar5 = std::
            vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
            ::size((vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                    *)&pos_end);
    if (sVar5 != 0) {
      pos_it = std::
               vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
               ::end((vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                      *)&pos_end);
      local_d0._M_current =
           (vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
           std::
           vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
           ::begin((vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                    *)&pos_end);
      while (bVar2 = __gnu_cxx::operator!=(&local_d0,&pos_it), bVar2) {
        local_e0._M_current =
             (vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
             std::
             vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
             ::end((vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                    *)&poly_end);
        __gnu_cxx::
        __normal_iterator<std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>const*,std::vector<std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>,std::allocator<std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>>>>
        ::__normal_iterator<std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>*>
                  ((__normal_iterator<std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>const*,std::vector<std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>,std::allocator<std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>>>>
                    *)&local_d8,&local_e0);
        __first = std::
                  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                  ::begin((vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                           *)&pos_end);
        __last = std::
                 vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                 ::end((vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                        *)&pos_end);
        std::
        vector<std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>,std::allocator<std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>>>
        ::
        insert<__gnu_cxx::__normal_iterator<std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>*,std::vector<std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>,std::allocator<std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>>>>,void>
                  ((vector<std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>,std::allocator<std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>>>
                    *)&poly_end,local_d8,
                   (__normal_iterator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_*,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>_>
                    )__first._M_current,
                   (__normal_iterator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_*,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>_>
                    )__last._M_current);
        __gnu_cxx::
        __normal_iterator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_*,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>_>
        ::operator++(&local_d0,0);
      }
    }
    std::
    vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ::~vector((vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
               *)&pos_end);
    std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::~vector
              ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
               &positive.
                super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    __gnu_cxx::
    __normal_iterator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_*,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>_>
    ::operator++(&local_88,0);
  }
  ClipperLib::Clipper::Clipper
            ((Clipper *)
             &solution_paths.
              super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::vector((vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
            *)&co.m_polyNodes.m_jointype);
  ClipperLib::ClipperOffset::ClipperOffset
            ((ClipperOffset *)
             &primary_paths.
              super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,2.0,0.25);
  ClipperLib::ClipperOffset::Clear
            ((ClipperOffset *)
             &primary_paths.
              super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ClipperLib::ClipperOffset::AddPaths
            ((ClipperOffset *)
             &primary_paths.
              super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(Paths *)&poly_end,jtMiter,
             etClosedPolygon);
  pJVar1 = &co.m_polyNodes.m_jointype;
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::clear((vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
           *)pJVar1);
  ClipperLib::ClipperOffset::Execute
            ((ClipperOffset *)
             &primary_paths.
              super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(Paths *)pJVar1,delta_00);
  ClipperLib::ClipperOffset::Clear
            ((ClipperOffset *)
             &primary_paths.
              super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ClipperLib::ClipperOffset::AddPaths
            ((ClipperOffset *)
             &primary_paths.
              super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(Paths *)&co.m_polyNodes.m_jointype
             ,jtMiter,etClosedPolygon);
  pJVar1 = &co.m_polyNodes.m_jointype;
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::clear((vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
           *)pJVar1);
  ClipperLib::ClipperOffset::Execute
            ((ClipperOffset *)
             &primary_paths.
              super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(Paths *)pJVar1,delta);
  ClipperLib::ClipperOffset::Clear
            ((ClipperOffset *)
             &primary_paths.
              super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if ((this->round_concave_corners & 1U) == 1) {
    ClipperLib::ClipperOffset::AddPaths
              ((ClipperOffset *)
               &primary_paths.
                super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (Paths *)&co.m_polyNodes.m_jointype,jtRound,etClosedPolygon);
  }
  else {
    ClipperLib::ClipperOffset::AddPaths
              ((ClipperOffset *)
               &primary_paths.
                super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (Paths *)&co.m_polyNodes.m_jointype,jtMiter,etClosedPolygon);
  }
  pJVar1 = &co.m_polyNodes.m_jointype;
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::clear((vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
           *)pJVar1);
  ClipperLib::ClipperOffset::Execute
            ((ClipperOffset *)
             &primary_paths.
              super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(Paths *)pJVar1,-delta);
  this_00 = &secondary_paths.
             super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::vector((vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
            *)this_00);
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::vector((vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
            *)local_368);
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::operator=((vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
               *)this_00,
              (vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
               *)&co.m_polyNodes.m_jointype);
  local_369 = filter_paths(this,(Paths *)&secondary_paths.
                                          super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (Paths *)local_368);
  tidy_paths(this,(Paths *)&secondary_paths.
                            super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
  tidy_paths(this,(Paths *)local_368);
  repair_circles(this,(Paths *)&secondary_paths.
                                super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  repair_circles(this,(Paths *)local_368);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_390,"",&local_391);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_390);
  std::__cxx11::string::~string((string *)&local_390);
  std::allocator<char>::~allocator(&local_391);
  std::__cxx11::to_string(&local_3d8,*mask_type_local);
  std::operator+(&local_3b8,"    # Layer ",&local_3d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_3b8);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::__cxx11::to_string(&local_418,*mask_type_local);
  std::operator+(&local_3f8,"    current_layer =  ",&local_418);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_3f8);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::__cxx11::string::~string((string *)&local_418);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_438,"    print(f\'Generating Layer {current_layer}.\')",&local_439);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_438);
  std::__cxx11::string::~string((string *)&local_438);
  std::allocator<char>::~allocator(&local_439);
  generate_freecad_solid
            (this,(Paths *)&secondary_paths.
                            super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,(Paths *)local_368,
             &local_369,mask_type_local,(int *)cont_wid);
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::~vector((vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
             *)local_368);
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::~vector((vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
             *)&secondary_paths.
                super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ClipperLib::ClipperOffset::~ClipperOffset
            ((ClipperOffset *)
             &primary_paths.
              super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::~vector((vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
             *)&co.m_polyNodes.m_jointype);
  ClipperLib::Clipper::~Clipper
            ((Clipper *)
             &solution_paths.
              super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::~vector((vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
             *)&poly_end);
  return 0;
}

Assistant:

int MODEL3D::three_dim_model::generate_non_fill_layer(const int &layer_number, const int &mask_type)
{
    double cont_wid = std::prev(etch_contour_map[layer_number].end(),1)->x;
    double countour_width = std::round(cont_wid*1.4);//40% tolerance to avoid bunching
    double foot_adjustment = std::round(-(countour_width/10));
    ClipperLib::Paths positives;
    auto poly_end = clipper_polygons_map[layer_number].end();
    // For each polygon on this layer.
    for (   auto poly_it = clipper_polygons_map[layer_number].begin();
            poly_it != poly_end; poly_it++)
    {
        ClipperLib::Path my_path = *poly_it;
        ClipperLib::Paths positive;
        ClipperLib::SimplifyPolygon(my_path, positive, ClipperLib::pftNonZero);
        if(positive.size()>0)
        {
            auto pos_end = positive.end();
            for (auto pos_it = positive.begin(); pos_it != pos_end; pos_it++)
            {
                positives.insert(positives.end(),positive.begin(),positive.end());
            }
        }
    }
    ClipperLib::Clipper my_mask;
    ClipperLib::Paths solution_paths;
    ClipperLib::ClipperOffset co;
    // shift by foot adjustment
    co.Clear();
    co.AddPaths(positives, ClipperLib::jtMiter, ClipperLib::etClosedPolygon);
    solution_paths.clear();
    co.Execute(solution_paths, foot_adjustment);
    // grow by contour width
    co.Clear();
    co.AddPaths(solution_paths, ClipperLib::jtMiter, ClipperLib::etClosedPolygon);
    solution_paths.clear();
    co.Execute(solution_paths, countour_width);
    // reduce by contour width (creates correct contour profile)
    co.Clear();
    if(round_concave_corners==true)
        co.AddPaths(solution_paths, ClipperLib::jtRound, ClipperLib::etClosedPolygon);
    else
        co.AddPaths(solution_paths, ClipperLib::jtMiter, ClipperLib::etClosedPolygon);
    solution_paths.clear();
    // co.ArcTolerance = 0.25;
    co.Execute(solution_paths, -countour_width);
    // filter into primary and secondary shapes
    ClipperLib::Paths primary_paths, secondary_paths;
    primary_paths = solution_paths;
    bool has_holes = filter_paths(primary_paths, secondary_paths);
    tidy_paths(primary_paths);
    tidy_paths(secondary_paths);
    repair_circles(primary_paths);
    repair_circles(secondary_paths);
    py_script.push_back("");
    py_script.push_back("    # Layer " + std::to_string(layer_number) );
    py_script.push_back("    current_layer =  " + std::to_string(layer_number) );
    py_script.push_back("    print(f'Generating Layer {current_layer}.')");
    generate_freecad_solid(primary_paths, secondary_paths, has_holes, layer_number, mask_type);
    // if (primary_paths.size()>0)
    //     clipper_paths_to_gds(primary_paths, "Primary_paths", layer_number);
    // if (secondary_paths.size()>0)
    //     clipper_paths_to_gds(secondary_paths, "Secondary_paths", layer_number);
    return EXIT_SUCCESS;
}